

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

void __thiscall mprpc::MpRpcClient::do_send_heartbeat(MpRpcClient *this)

{
  atomic<int> *paVar1;
  element_type *peVar2;
  undefined2 uVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  uint64_t val_00;
  uint16_t val;
  ushort uVar7;
  uchar d;
  MsgPackPacker pk;
  MsgPackPacker pk_params;
  char local_81;
  uint local_80;
  uint local_7c;
  MsgPackPacker local_78;
  MsgPackPacker local_48;
  
  iVar5 = (*((this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Connection[7])();
  if ((char)iVar5 != '\0') {
    LOCK();
    paVar1 = &this->m_cur_callid;
    iVar5 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    local_48.pk.data = &local_48;
    local_48.sb.size = 0;
    local_48.sb.data = (char *)0x0;
    local_48.sb.alloc = 0;
    local_48.pk.callback = msgpack_sbuffer_write;
    pcVar6 = (char *)realloc((void *)0x0,0x2000);
    if (pcVar6 != (char *)0x0) {
      pcVar6[local_48.sb.size] = -0x7f;
      local_48.sb.size = local_48.sb.size + 1;
      local_48.sb.data = pcVar6;
      local_48.sb.alloc = 0x2000;
    }
    val_00 = std::chrono::_V2::system_clock::now();
    MsgPackPacker::pack_map_item(&local_48,"time",val_00);
    local_78.pk.data = &local_78;
    local_78.sb.size = 0;
    local_78.sb.data = (char *)0x0;
    local_78.sb.alloc = 0;
    local_78.pk.callback = msgpack_sbuffer_write;
    pcVar6 = (char *)realloc((void *)0x0,0x2000);
    if (pcVar6 != (char *)0x0) {
      pcVar6[local_78.sb.size] = -0x7d;
      local_78.sb.size = local_78.sb.size + 1;
      local_78.sb.data = pcVar6;
      local_78.sb.alloc = 0x2000;
    }
    local_81 = -0x5e;
    (*local_78.pk.callback)(local_78.pk.data,&local_81,1);
    (*local_78.pk.callback)(local_78.pk.data,"id",2);
    local_7c = iVar5 + 1;
    uVar7 = (ushort)local_7c;
    uVar3 = local_80._2_2_;
    if ((int)local_7c < -0x20) {
      if ((int)local_7c < -0x8000) {
        local_81 = -0x2e;
        local_80 = local_7c >> 0x18 | (local_7c & 0xff0000) >> 8 | (local_7c & 0xff00) << 8 |
                   local_7c * 0x1000000;
        (*local_78.pk.callback)(local_78.pk.data,&local_81,5);
      }
      else if ((int)local_7c < -0x80) {
        local_81 = -0x2f;
        local_80 = CONCAT22(uVar3,uVar7 << 8 | uVar7 >> 8);
        (*local_78.pk.callback)(local_78.pk.data,&local_81,3);
      }
      else {
        local_81 = -0x30;
        local_80 = CONCAT31(local_80._1_3_,(undefined1)local_7c);
        (*local_78.pk.callback)(local_78.pk.data,&local_81,2);
      }
    }
    else if ((int)local_7c < 0x80) {
      (*local_78.pk.callback)(local_78.pk.data,(char *)&local_7c,1);
    }
    else if ((int)local_7c < 0x100) {
      local_81 = -0x34;
      local_80 = CONCAT31(local_80._1_3_,(undefined1)local_7c);
      (*local_78.pk.callback)(local_78.pk.data,&local_81,2);
    }
    else if ((int)local_7c < 0x10000) {
      local_81 = -0x33;
      local_80 = CONCAT22(uVar3,uVar7 << 8 | uVar7 >> 8);
      (*local_78.pk.callback)(local_78.pk.data,&local_81,3);
    }
    else {
      local_81 = -0x32;
      local_80 = local_7c >> 0x18 | (local_7c & 0xff0000) >> 8 | (local_7c & 0xff00) << 8 |
                 local_7c * 0x1000000;
      (*local_78.pk.callback)(local_78.pk.data,&local_81,5);
    }
    MsgPackPacker::pack_map_item(&local_78,"method",".sys.heartbeat");
    pcVar6 = local_48.sb.data;
    sVar4 = local_48.sb.size;
    local_81 = -0x5a;
    (*local_78.pk.callback)(local_78.pk.data,&local_81,1);
    (*local_78.pk.callback)(local_78.pk.data,"params",6);
    (*local_78.pk.callback)(local_78.pk.data,pcVar6,sVar4);
    peVar2 = (this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Connection[5])(peVar2,local_78.sb.data,local_78.sb.size);
    free(local_78.sb.data);
    free(local_48.sb.data);
  }
  return;
}

Assistant:

void MpRpcClient::do_send_heartbeat()
    {
        if (!m_conn->is_connected()) return;

        int callid = ++m_cur_callid;

        MsgPackPacker pk_params;
        pk_params.pack_map(1);
        pk_params.pack_map_item("time", (uint64_t)system_clock::now().time_since_epoch().count());
         
        MsgPackPacker pk;
        pk.pack_map(3);
        pk.pack_map_item    ("id",     callid);
        pk.pack_map_item    ("method", ".sys.heartbeat");
        pk.pack_map_item_obj("params", pk_params.sb.data, pk_params.sb.size);

        m_conn->send(pk.sb.data, pk.sb.size);
    }